

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

BackwardMatch * __thiscall
brotli::HashToBinaryTree::StoreAndFindMatches
          (HashToBinaryTree *this,uint8_t *data,size_t cur_ix,size_t ring_buffer_mask,
          size_t max_length,size_t *best_len,BackwardMatch *matches)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint32_t *puVar4;
  ulong uVar5;
  uint uVar6;
  uint8_t *puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  long local_a0;
  long local_98;
  
  uVar15 = ring_buffer_mask & cur_ix;
  uVar3 = this->window_mask_;
  uVar6 = (uint)(*(int *)(data + uVar15) * 0x1e35a7bd) >> 0xf;
  uVar9 = uVar3 & cur_ix;
  uVar18 = (ulong)this->buckets_[uVar6];
  uVar5 = max_length;
  if (0x7f < max_length) {
    this->buckets_[uVar6] = (uint32_t)cur_ix;
    uVar5 = 0x80;
  }
  local_a0 = uVar9 * 2 + 1;
  local_98 = uVar9 * 2;
  if (uVar18 != cur_ix) {
    lVar13 = 0x40;
    uVar16 = 0;
    uVar9 = 0;
    do {
      bVar19 = lVar13 == 0;
      lVar13 = lVar13 + -1;
      if ((uVar3 - 0xf < cur_ix - uVar18) || (bVar19)) break;
      uVar17 = uVar16;
      if (uVar9 < uVar16) {
        uVar17 = uVar9;
      }
      puVar1 = data + uVar17 + (uVar18 & ring_buffer_mask);
      uVar14 = max_length - uVar17;
      if (7 < uVar14) {
        uVar10 = uVar14 & 0xfffffffffffffff8;
        puVar7 = puVar1 + uVar10;
        lVar8 = 0;
        uVar11 = 0;
LAB_0016d8ca:
        if (*(ulong *)(puVar1 + uVar11 * 8) == *(ulong *)(data + uVar11 * 8 + uVar17 + uVar15))
        goto code_r0x0016d8d8;
        uVar10 = *(ulong *)(data + uVar11 * 8 + uVar17 + uVar15) ^ *(ulong *)(puVar1 + uVar11 * 8);
        uVar14 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        uVar11 = (uVar14 >> 3 & 0x1fffffff) - lVar8;
        goto LAB_0016d92c;
      }
      uVar10 = 0;
      puVar7 = puVar1;
LAB_0016d9de:
      uVar14 = uVar14 & 7;
      uVar11 = uVar10;
      if (uVar14 != 0) {
        uVar12 = uVar10 | uVar14;
        do {
          uVar11 = uVar10;
          if (data[uVar10 + uVar17 + uVar15] != *puVar7) break;
          puVar7 = puVar7 + 1;
          uVar10 = uVar10 + 1;
          uVar14 = uVar14 - 1;
          uVar11 = uVar12;
        } while (uVar14 != 0);
      }
LAB_0016d92c:
      uVar11 = uVar11 + uVar17;
      if (*best_len < uVar11) {
        *best_len = uVar11;
        if (matches == (BackwardMatch *)0x0) {
          matches = (BackwardMatch *)0x0;
        }
        else {
          *matches = (BackwardMatch)(cur_ix - uVar18 & 0xffffffff | uVar11 << 0x25);
          matches = matches + 1;
        }
        if (uVar5 <= uVar11) {
          if (max_length < 0x80) {
            return matches;
          }
          puVar4 = this->forest_;
          uVar18 = uVar18 & this->window_mask_;
          puVar4[local_98] = puVar4[uVar18 * 2];
          puVar4[local_a0] = puVar4[uVar18 * 2 + 1];
          return matches;
        }
      }
      puVar4 = this->forest_;
      if (data[uVar11 + (uVar18 & ring_buffer_mask)] < data[uVar11 + uVar15]) {
        if (0x7f < max_length) {
          puVar4[local_98] = (uint32_t)uVar18;
        }
        lVar8 = (uVar18 & this->window_mask_) * 2 + 1;
        uVar16 = uVar11;
        local_98 = lVar8;
      }
      else {
        if (0x7f < max_length) {
          puVar4[local_a0] = (uint32_t)uVar18;
        }
        lVar8 = (uVar18 & this->window_mask_) * 2;
        uVar9 = uVar11;
        local_a0 = lVar8;
      }
      uVar18 = (ulong)puVar4[lVar8];
    } while (uVar18 != cur_ix);
  }
  if (0x7f < max_length) {
    uVar2 = this->invalid_pos_;
    puVar4 = this->forest_;
    puVar4[local_98] = uVar2;
    puVar4[local_a0] = uVar2;
  }
  return matches;
code_r0x0016d8d8:
  uVar11 = uVar11 + 1;
  lVar8 = lVar8 + -8;
  if (uVar14 >> 3 == uVar11) goto LAB_0016d9de;
  goto LAB_0016d8ca;
}

Assistant:

BackwardMatch* StoreAndFindMatches(const uint8_t* const __restrict data,
                                     const size_t cur_ix,
                                     const size_t ring_buffer_mask,
                                     const size_t max_length,
                                     size_t* const __restrict best_len,
                                     BackwardMatch* __restrict matches) {
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const size_t max_backward = window_mask_ - 15;
    const size_t max_comp_len = std::min(max_length, kMaxTreeCompLength);
    const bool reroot_tree = max_length >= kMaxTreeCompLength;
    const uint32_t key = HashBytes(&data[cur_ix_masked]);
    size_t prev_ix = buckets_[key];
    // The forest index of the rightmost node of the left subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t node_left = LeftChildIndex(cur_ix);
    // The forest index of the leftmost node of the right subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t node_right = RightChildIndex(cur_ix);
    // The match length of the rightmost node of the left subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t best_len_left = 0;
    // The match length of the leftmost node of the right subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t best_len_right = 0;
    if (reroot_tree) {
      buckets_[key] = static_cast<uint32_t>(cur_ix);
    }
    for (size_t depth_remaining = kMaxTreeSearchDepth; ; --depth_remaining) {
      const size_t backward = cur_ix - prev_ix;
      const size_t prev_ix_masked = prev_ix & ring_buffer_mask;
      if (backward == 0 || backward > max_backward || depth_remaining == 0) {
        if (reroot_tree) {
          forest_[node_left] = invalid_pos_;
          forest_[node_right] = invalid_pos_;
        }
        break;
      }
      const size_t cur_len = std::min(best_len_left, best_len_right);
      const size_t len = cur_len +
          FindMatchLengthWithLimit(&data[cur_ix_masked + cur_len],
                                   &data[prev_ix_masked + cur_len],
                                   max_length - cur_len);
      if (len > *best_len) {
        *best_len = len;
        if (matches) {
          *matches++ = BackwardMatch(backward, len);
        }
        if (len >= max_comp_len) {
          if (reroot_tree) {
            forest_[node_left] = forest_[LeftChildIndex(prev_ix)];
            forest_[node_right] = forest_[RightChildIndex(prev_ix)];
          }
          break;
        }
      }
      if (data[cur_ix_masked + len] > data[prev_ix_masked + len]) {
        best_len_left = len;
        if (reroot_tree) {
          forest_[node_left] = static_cast<uint32_t>(prev_ix);
        }
        node_left = RightChildIndex(prev_ix);
        prev_ix = forest_[node_left];
      } else {
        best_len_right = len;
        if (reroot_tree) {
          forest_[node_right] = static_cast<uint32_t>(prev_ix);
        }
        node_right = LeftChildIndex(prev_ix);
        prev_ix = forest_[node_right];
      }
    }
    return matches;
  }